

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

int __thiscall deqp::egl::MakeCurrentPerfCase::init(MakeCurrentPerfCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  EGLDisplay pvVar1;
  
  pvVar1 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar1;
  chooseConfig(this);
  createContexts(this);
  createSurfaces(this);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfCase::init (void)
{
	m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	chooseConfig();
	createContexts();
	createSurfaces();
}